

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_FindValueByName_Test::
EnumDescriptorTest_FindValueByName_Test(EnumDescriptorTest_FindValueByName_Test *this)

{
  EnumDescriptorTest_FindValueByName_Test *this_local;
  
  EnumDescriptorTest::EnumDescriptorTest(&this->super_EnumDescriptorTest);
  (this->super_EnumDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EnumDescriptorTest_FindValueByName_Test_029a6438;
  return;
}

Assistant:

TEST_F(EnumDescriptorTest, FindValueByName) {
  EXPECT_EQ(foo_, enum_->FindValueByName("FOO"));
  EXPECT_EQ(bar_, enum_->FindValueByName("BAR"));
  EXPECT_EQ(foo2_, enum2_->FindValueByName("FOO"));
  EXPECT_EQ(baz2_, enum2_->FindValueByName("BAZ"));

  EXPECT_TRUE(enum_->FindValueByName("NO_SUCH_VALUE") == nullptr);
  EXPECT_TRUE(enum_->FindValueByName("BAZ") == nullptr);
  EXPECT_TRUE(enum2_->FindValueByName("BAR") == nullptr);
}